

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMLSParserImpl::parseWithContext
          (DOMLSParserImpl *this,DOMLSInput *source,DOMNode *contextNode,ActionType action)

{
  bool bVar1;
  _func_int **pp_Var2;
  int iVar3;
  ValSchemes newScheme;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  DOMDocumentFragment *pDVar6;
  DOMNode *pDVar7;
  XMLSize_t XVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long *plVar9;
  DOMException *this_00;
  DOMLSException *this_01;
  Wrapper4DOMLSInput isWrapper;
  Wrapper4DOMLSInput local_70;
  undefined4 extraout_var_00;
  
  if ((this->super_AbstractDOMParser).fParseInProgress == true) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,0xb,0x21,(this->super_AbstractDOMParser).fMemoryManager);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (this->fFilter == (DOMLSParserFilter *)&g_AbortFilter) {
    this->fFilter = (DOMLSParserFilter *)0x0;
  }
  if (this->fFilterAction !=
      (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)0x0)
  {
    ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::
    removeAll(this->fFilterAction);
  }
  if (this->fFilterDelayedTextNodes != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0) {
    ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeAll(this->fFilterDelayedTextNodes);
  }
  iVar3 = (*contextNode->_vptr_DOMNode[0xc])(contextNode);
  pDVar6 = (DOMDocumentFragment *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x20))
                     ((long *)CONCAT44(extraout_var,iVar3));
  pDVar7 = contextNode;
  if (action - ACTION_INSERT_BEFORE < 3) {
    iVar3 = (*contextNode->_vptr_DOMNode[5])(contextNode);
    pDVar7 = (DOMNode *)CONCAT44(extraout_var_00,iVar3);
  }
  this->fWrapNodesContext = pDVar7;
  this->fWrapNodesInDocumentFragment = pDVar6;
  this->fWrapNodesAction = action;
  newScheme = AbstractDOMParser::getValidationScheme(&this->super_AbstractDOMParser);
  AbstractDOMParser::setValidationScheme(&this->super_AbstractDOMParser,Val_Never);
  bVar1 = (this->super_AbstractDOMParser).fIncludeIgnorableWhitespace;
  (this->super_AbstractDOMParser).fIncludeIgnorableWhitespace = true;
  Wrapper4DOMLSInput::Wrapper4DOMLSInput
            (&local_70,source,this->fEntityResolver,false,
             (this->super_AbstractDOMParser).fMemoryManager);
  AbstractDOMParser::parse(&this->super_AbstractDOMParser,&local_70.super_InputSource);
  AbstractDOMParser::setValidationScheme(&this->super_AbstractDOMParser,newScheme);
  (this->super_AbstractDOMParser).fIncludeIgnorableWhitespace = bVar1;
  (this->super_AbstractDOMParser).fDocument = (DOMDocumentImpl *)0x0;
  this->fWrapNodesInDocumentFragment = (DOMDocumentFragment *)0x0;
  this->fWrapNodesContext = (DOMNode *)0x0;
  XVar8 = AbstractDOMParser::getErrorCount(&this->super_AbstractDOMParser);
  pp_Var2 = (pDVar6->super_DOMNode)._vptr_DOMNode;
  if (XVar8 != 0) {
    (*pp_Var2[0x27])(pDVar6);
    this_01 = (DOMLSException *)__cxa_allocate_exception(0x28);
    DOMLSException::DOMLSException(this_01,0x51,0x23,(this->super_AbstractDOMParser).fMemoryManager)
    ;
    __cxa_throw(this_01,&DOMLSException::typeinfo,DOMLSException::~DOMLSException);
  }
  iVar3 = (*pp_Var2[7])(pDVar6);
  iVar4 = (*contextNode->_vptr_DOMNode[5])(contextNode);
  plVar9 = (long *)CONCAT44(extraout_var_02,iVar4);
  switch(action) {
  case ACTION_REPLACE_CHILDREN:
    while( true ) {
      iVar4 = (*contextNode->_vptr_DOMNode[7])(contextNode);
      if (CONCAT44(extraout_var_07,iVar4) == 0) break;
      iVar4 = (*contextNode->_vptr_DOMNode[0x10])(contextNode,CONCAT44(extraout_var_07,iVar4));
      (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x138))
                ((long *)CONCAT44(extraout_var_08,iVar4));
    }
  case ACTION_APPEND_AS_CHILDREN:
    while( true ) {
      iVar4 = (*(pDVar6->super_DOMNode)._vptr_DOMNode[7])(pDVar6);
      if (CONCAT44(extraout_var_03,iVar4) == 0) break;
      iVar4 = (*(pDVar6->super_DOMNode)._vptr_DOMNode[0x10])(pDVar6,CONCAT44(extraout_var_03,iVar4))
      ;
      (*contextNode->_vptr_DOMNode[0x11])(contextNode,CONCAT44(extraout_var_04,iVar4));
    }
    break;
  case ACTION_INSERT_BEFORE:
    while( true ) {
      iVar4 = (*(pDVar6->super_DOMNode)._vptr_DOMNode[7])(pDVar6);
      if (CONCAT44(extraout_var_06,iVar4) == 0) break;
      iVar4 = (*(pDVar6->super_DOMNode)._vptr_DOMNode[0x10])(pDVar6,CONCAT44(extraout_var_06,iVar4))
      ;
      (**(code **)(*plVar9 + 0x70))(plVar9,iVar4,contextNode);
    }
    break;
  case ACTION_INSERT_AFTER:
    while( true ) {
      iVar4 = (*(pDVar6->super_DOMNode)._vptr_DOMNode[8])(pDVar6);
      if (CONCAT44(extraout_var_09,iVar4) == 0) break;
      iVar4 = (*(pDVar6->super_DOMNode)._vptr_DOMNode[0x10])(pDVar6,CONCAT44(extraout_var_09,iVar4))
      ;
      iVar5 = (*contextNode->_vptr_DOMNode[10])(contextNode);
      (**(code **)(*plVar9 + 0x70))(plVar9,iVar4,iVar5);
    }
    break;
  case ACTION_REPLACE:
    while( true ) {
      iVar4 = (*(pDVar6->super_DOMNode)._vptr_DOMNode[7])(pDVar6);
      if (CONCAT44(extraout_var_05,iVar4) == 0) break;
      iVar4 = (*(pDVar6->super_DOMNode)._vptr_DOMNode[0x10])(pDVar6,CONCAT44(extraout_var_05,iVar4))
      ;
      (**(code **)(*plVar9 + 0x70))(plVar9,iVar4,contextNode);
    }
    plVar9 = (long *)(**(code **)(*plVar9 + 0x80))(plVar9,contextNode);
    (**(code **)(*plVar9 + 0x138))(plVar9);
  }
  (*(pDVar6->super_DOMNode)._vptr_DOMNode[0x27])(pDVar6);
  Wrapper4DOMLSInput::~Wrapper4DOMLSInput(&local_70);
  return (DOMNode *)CONCAT44(extraout_var_01,iVar3);
}

Assistant:

DOMNode* DOMLSParserImpl::parseWithContext(const DOMLSInput* source,
                                           DOMNode* contextNode,
                                           const ActionType action)
{
    if (getParseInProgress())
        throw DOMException(DOMException::INVALID_STATE_ERR, XMLDOMMsg::LSParser_ParseInProgress, fMemoryManager);

    // remove the abort filter, if present
    if(fFilter==&g_AbortFilter)
        fFilter=0;
    if(fFilterAction)
        fFilterAction->removeAll();
    if(fFilterDelayedTextNodes)
        fFilterDelayedTextNodes->removeAll();

    DOMDocumentFragment* holder = contextNode->getOwnerDocument()->createDocumentFragment();
    // When parsing the input stream, the context node (or its parent, depending on where
    // the result will be inserted) is used for resolving unbound namespace prefixes
    if(action==ACTION_INSERT_BEFORE || action==ACTION_INSERT_AFTER || action==ACTION_REPLACE)
        fWrapNodesContext = contextNode->getParentNode();
    else
        fWrapNodesContext = contextNode;
    fWrapNodesInDocumentFragment = holder;
    fWrapNodesAction = action;
    // When calling parseWithContext, the values of the following configuration parameters
    // will be ignored and their default values will always be used instead: "validate",
    // "validate-if-schema", and "element-content-whitespace".
    ValSchemes oldValidate = getValidationScheme();
    setValidationScheme(Val_Never);
    bool oldElementContentWhitespace = getIncludeIgnorableWhitespace();
    setIncludeIgnorableWhitespace(true);

    Wrapper4DOMLSInput isWrapper((DOMLSInput*)source, fEntityResolver, false, getMemoryManager());
    AbstractDOMParser::parse(isWrapper);

    setValidationScheme(oldValidate);
    setIncludeIgnorableWhitespace(oldElementContentWhitespace);
    fWrapNodesContext = NULL;
    fWrapNodesInDocumentFragment = NULL;
    fDocument = NULL;

    if(getErrorCount()!=0)
    {
        holder->release();
        throw DOMLSException(DOMLSException::PARSE_ERR, XMLDOMMsg::LSParser_ParsingFailed, fMemoryManager);
    }

    DOMNode* result = holder->getFirstChild();
    DOMNode* node, *parent = contextNode->getParentNode();
    switch(action)
    {
    case ACTION_REPLACE_CHILDREN:
        // remove existing children
        while((node = contextNode->getFirstChild())!=NULL)
            contextNode->removeChild(node)->release();
        // then fall back to behave like an append
    case ACTION_APPEND_AS_CHILDREN:
        while((node = holder->getFirstChild())!=NULL)
            contextNode->appendChild(holder->removeChild(node));
        break;
    case ACTION_INSERT_BEFORE:
        while((node = holder->getFirstChild())!=NULL)
            parent->insertBefore(holder->removeChild(node), contextNode);
        break;
    case ACTION_INSERT_AFTER:
        while((node = holder->getLastChild())!=NULL)
            parent->insertBefore(holder->removeChild(node), contextNode->getNextSibling());
        break;
    case ACTION_REPLACE:
        while((node = holder->getFirstChild())!=NULL)
            parent->insertBefore(holder->removeChild(node), contextNode);
        parent->removeChild(contextNode)->release();
        break;
    }
    holder->release();

    // TODO whenever we add support for DOM Mutation Events:
    //   As the new data is inserted into the document, at least one mutation event is fired
    //   per new immediate child or sibling of the context node.
    return result;
}